

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void add_door(level *lev,int x,int y,mkroom *aroom)

{
  ulong uVar1;
  schar *psVar2;
  uint uVar3;
  
  aroom->doorct = aroom->doorct + '\x01';
  uVar3 = lev->doorindex;
  if (aroom[1].hx < '\0') {
    uVar1 = (ulong)uVar3;
  }
  else {
    for (uVar1 = (ulong)(int)uVar3; (long)aroom[1].fdoor < (long)uVar1; uVar1 = uVar1 - 1) {
      lev->doors[uVar1] = lev->doors[uVar1 - 1];
    }
    uVar3 = lev->doorindex;
  }
  lev->doorindex = uVar3 + 1;
  lev->doors[(int)uVar1].x = (xchar)x;
  lev->doors[(int)uVar1].y = (xchar)y;
  for (psVar2 = &aroom[1].fdoor; -1 < psVar2[-7]; psVar2 = psVar2 + 0xd8) {
    *psVar2 = *psVar2 + '\x01';
  }
  return;
}

Assistant:

void add_door(struct level *lev, int x, int y, struct mkroom *aroom)
{
	struct mkroom *broom;
	int tmp;

	aroom->doorct++;
	broom = aroom+1;
	if (broom->hx < 0)
		tmp = lev->doorindex;
	else
		for (tmp = lev->doorindex; tmp > broom->fdoor; tmp--)
			lev->doors[tmp] = lev->doors[tmp-1];
	lev->doorindex++;
	lev->doors[tmp].x = x;
	lev->doors[tmp].y = y;
	for ( ; broom->hx >= 0; broom++) broom->fdoor++;
}